

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TimingControlStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TimingControlStatementSyntax *this,
          size_t index)

{
  SyntaxNode *node;
  StatementSyntax *node_00;
  SyntaxNode *local_40;
  size_t index_local;
  TimingControlStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_40 = (SyntaxNode *)0x0;
    if (this != (TimingControlStatementSyntax *)0xffffffffffffffe8) {
      local_40 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
    break;
  case 2:
    node = &not_null<slang::syntax::TimingControlSyntax_*>::get(&this->timingControl)->
            super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    node_00 = not_null<slang::syntax::StatementSyntax_*>::get(&this->statement);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TimingControlStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return timingControl.get();
        case 3: return statement.get();
        default: return nullptr;
    }
}